

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  undefined4 *puVar2;
  char *pcVar3;
  undefined1 *puVar4;
  long lVar5;
  functest *pp_Var6;
  int iVar7;
  bool bVar8;
  
  puVar2 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar2 = 0;
  iVar7 = 0;
  xmlPedanticParserDefault(0);
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  xmlSetExternalEntityLoader(testExternalEntityLoader);
  xmlSetStructuredErrorFunc(0,testStructuredErrorHandler);
  iVar1 = xmlRegisterInputCallbacks(hugeMatch,hugeOpen,hugeRead,hugeClose);
  if (iVar1 < 0) {
    fwrite("failed to register Huge handler\n",0x20,1,_stderr);
    exit(1);
  }
  lVar5 = 1;
  do {
    if (argc <= lVar5) {
      if (iVar7 == 0) {
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          runtest((int)lVar5);
        }
      }
      bVar8 = nb_errors != 0 || nb_leaks != 0;
      if (bVar8) {
        printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests);
      }
      else {
        printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
      }
      xmlCleanupParser();
      xmlMemoryDump();
      return (uint)bVar8;
    }
    pcVar3 = argv[lVar5];
    if (((*pcVar3 == '-') && (pcVar3[1] == 'v')) && (puVar4 = &verbose, pcVar3[2] == '\0')) {
LAB_00102489:
      *puVar4 = 1;
    }
    else {
      iVar1 = strcmp(pcVar3,"-quiet");
      puVar4 = &tests_quiet;
      if (iVar1 == 0) goto LAB_00102489;
      iVar1 = 0;
      for (pp_Var6 = &testDescriptions[0].func; *pp_Var6 != (functest)0x0; pp_Var6 = pp_Var6 + 7) {
        pcVar3 = strstr(((testDesc *)(pp_Var6 + -1))->desc,argv[lVar5]);
        if (pcVar3 != (char *)0x0) {
          runtest(iVar1);
          iVar7 = iVar7 + 1;
        }
        iVar1 = iVar1 + 1;
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int i, a, ret = 0;
    int subset = 0;

    initializeLibxml2();

    for (a = 1; a < argc;a++) {
        if (!strcmp(argv[a], "-v"))
	    verbose = 1;
        else if (!strcmp(argv[a], "-quiet"))
	    tests_quiet = 1;
	else {
	    for (i = 0; testDescriptions[i].func != NULL; i++) {
	        if (strstr(testDescriptions[i].desc, argv[a])) {
		    ret += runtest(i);
		    subset++;
		}
	    }
	}
    }
    if (subset == 0) {
	for (i = 0; testDescriptions[i].func != NULL; i++) {
	    ret += runtest(i);
	}
    }
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlCleanupParser();
    xmlMemoryDump();

    return(ret);
}